

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::AddSubdiagonalValues(Codec *this)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ulong *puVar6;
  byte bVar7;
  uint uVar8;
  void *vy;
  uint *in_RDI;
  uint8_t *src_2;
  uint column_j;
  uint bit_j;
  uint64_t ge_mask_1;
  uint64_t *ge_row_3;
  uint8_t *src_1;
  uint8_t code_value;
  uint sub_i;
  uint8_t *heavy_row;
  uint16_t heavy_row_i;
  uint ge_limit;
  uint8_t *dest_3;
  uint16_t ge_row_i_2;
  uint column_i;
  uint ge_column_i;
  uint remaining_columns;
  uint8_t *dest_2;
  uint32_t win_bits_1;
  uint64_t *ge_row_2;
  uint16_t ge_row_i_1;
  uint ge_below_i_1;
  uint shift1;
  uint8_t *dest_1;
  uint win_bits;
  uint64_t *ge_row_1;
  uint16_t ge_row_i;
  uint ge_below_i;
  uint16_t *pivot_row;
  uint last_word;
  uint shift0;
  uint first_word;
  uint ii_3;
  uint ii_2;
  uint ii_1;
  uint ii;
  uint8_t *dest;
  uint16_t dest_col_i;
  uint16_t dest_row_i;
  uint dest_pivot_i;
  uint64_t *ge_row;
  uint8_t *src;
  uint src_pivot_i;
  uint64_t ge_mask;
  uint final_i;
  uint32_t count;
  uint32_t jj;
  uint8_t *column_src;
  PeelColumn *column;
  uint8_t *win_table [128];
  uint32_t win_lim;
  uint next_check_i;
  uint w;
  uint16_t first_non_binary_row;
  uint16_t first_heavy_row;
  uint pivot_i;
  uint column_count;
  uint local_534;
  ulong local_530;
  uint local_514;
  uint local_504;
  uint local_4f0;
  uint local_4c8;
  uint local_4a4;
  ushort *local_4a0;
  uint local_488;
  uint local_484;
  uint local_480;
  uint local_47c;
  uint local_46c;
  uint local_454;
  ulong local_450;
  uint local_440;
  uint local_43c;
  long local_438;
  long local_430;
  long lStackY_428;
  int bytes;
  void *in_stack_fffffffffffffbf0;
  void *in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffccc;
  void *in_stack_fffffffffffffcd0;
  void *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffeb4;
  void *in_stack_fffffffffffffeb8;
  uint8_t in_stack_fffffffffffffec7;
  void *in_stack_fffffffffffffec8;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_10;
  
  uVar4 = (uint)*(ushort *)((long)in_RDI + 0x8e) + (uint)(ushort)in_RDI[6];
  local_10 = 0;
  uVar2 = *(short *)((long)in_RDI + 0x8e) + *(short *)((long)in_RDI + 10);
  uVar3 = uVar2 + (short)in_RDI[5];
  local_4f0 = local_10;
  if (0x45 < uVar4) {
    if (uVar4 < 0x91) {
      if (uVar4 < 0x5b) {
        if (uVar4 < 0x46) {
          local_18 = 4;
          local_1c = 0x31;
        }
        else {
          local_18 = 5;
          local_1c = uVar4 - 0x46;
        }
      }
      else {
        local_18 = 6;
        local_1c = uVar4 - 0x5b;
      }
    }
    else {
      local_18 = 7;
      local_1c = uVar4 - 0x91;
    }
    local_20 = 1 << (sbyte)local_18;
    local_430 = *(long *)(in_RDI + 0x1a);
    local_438 = *(long *)(in_RDI + 8);
    local_43c = 1;
    for (local_440 = (uint)(ushort)in_RDI[1]; local_440 != 0; local_440 = local_440 - 1) {
      if (*(char *)(local_430 + 4) == '\x01') {
        (&lStackY_428)[local_43c] = local_438;
        local_43c = local_43c + 1;
        if (local_20 <= local_43c) break;
      }
      local_430 = local_430 + 6;
      local_438 = local_438 + (ulong)*in_RDI;
    }
    if (local_20 <= local_43c) {
LAB_0010bfb4:
      do {
        local_4c8 = local_10 + local_18;
        uVar5 = local_4c8 - 1;
        local_450 = 1L << ((byte)local_10 & 0x3f);
        for (local_454 = local_10; local_454 < uVar5; local_454 = local_454 + 1) {
          lVar1 = *(long *)(in_RDI + 0x26);
          local_46c = local_454;
          while (local_46c = local_46c + 1, local_46c <= uVar5) {
            if ((*(ulong *)(lVar1 + (ulong)(local_454 >> 6) * 8 +
                           (ulong)(in_RDI[0x2a] *
                                  (uint)*(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_46c * 2)
                                  ) * 8) & local_450) != 0) {
              gf256_add_mem(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                            in_stack_fffffffffffffccc);
            }
          }
          local_450 = local_450 << 1 | local_450 >> 0x3f;
        }
        vy = (void *)(*(long *)(in_RDI + 8) +
                     (ulong)(*in_RDI *
                            (uint)*(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)(local_10 + 1) * 2))
                     );
        bytes = (int)(*(long *)(in_RDI + 8) +
                      (ulong)(*in_RDI *
                             (uint)*(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)local_10 * 2)) >>
                     0x20);
        gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
        in_stack_fffffffffffffbf8 =
             (void *)(*(long *)(in_RDI + 8) +
                     (ulong)(*in_RDI *
                            (uint)*(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)(local_10 + 2) * 2))
                     );
        gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
        gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
        gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
        for (local_47c = 1; local_47c < 8; local_47c = local_47c + 1) {
          gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
        }
        if (4 < local_18) {
          for (local_480 = 1; local_480 < 0x10; local_480 = local_480 + 1) {
            gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
          }
          if (5 < local_18) {
            in_stack_fffffffffffffcd8 =
                 (void *)(*(long *)(in_RDI + 8) +
                         (ulong)(*in_RDI *
                                (uint)*(ushort *)
                                       (*(long *)(in_RDI + 0x32) + (ulong)(local_10 + 5) * 2)));
            for (local_484 = 1; local_484 < 0x20; local_484 = local_484 + 1) {
              gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
            }
            if (6 < local_18) {
              for (local_488 = 1; local_488 < 0x40; local_488 = local_488 + 1) {
                gf256_addset_mem(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,vy,bytes);
              }
            }
          }
        }
        uVar8 = local_10 >> 6;
        bVar7 = (byte)local_10 & 0x3f;
        local_4a0 = (ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)uVar5 * 2 + 2);
        local_4a4 = local_4c8;
        if (uVar8 == uVar5 >> 6) {
          for (; local_4a4 < uVar4; local_4a4 = local_4a4 + 1) {
            if ((*local_4a0 < uVar3) &&
               (((uint)(*(ulong *)(*(long *)(in_RDI + 0x26) + (ulong)uVar8 * 8 +
                                  (ulong)(in_RDI[0x2a] * (uint)*local_4a0) * 8) >> bVar7) &
                local_20 - 1) != 0)) {
              gf256_add_mem(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                            in_stack_fffffffffffffccc);
            }
            local_4a0 = local_4a0 + 1;
          }
        }
        else {
          for (; local_4c8 < uVar4; local_4c8 = local_4c8 + 1) {
            if ((*local_4a0 < uVar3) &&
               (puVar6 = (ulong *)(*(long *)(in_RDI + 0x26) + (ulong)uVar8 * 8 +
                                  (ulong)(in_RDI[0x2a] * (uint)*local_4a0) * 8),
               (((uint)(*puVar6 >> bVar7) | (uint)(puVar6[1] << (0x40 - bVar7 & 0x3f))) &
               local_20 - 1) != 0)) {
              gf256_add_mem(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                            in_stack_fffffffffffffccc);
            }
            local_4a0 = local_4a0 + 1;
          }
        }
        local_10 = local_18 + local_10;
      } while (local_10 < local_1c);
      local_1c = uVar4 - local_10;
      if (local_1c < 0x5b) {
        if (local_1c < 0x46) {
          local_4f0 = local_10;
          if (local_1c < 0x31) goto LAB_0010c8c3;
          local_18 = 4;
          local_1c = local_1c - 0x31;
        }
        else {
          local_18 = 5;
          local_1c = local_1c - 0x46;
        }
      }
      else {
        local_18 = 6;
        local_1c = local_1c - 0x5b;
      }
      local_20 = 1 << (sbyte)local_18;
      goto LAB_0010bfb4;
    }
  }
LAB_0010c8c3:
  local_4f0 = local_4f0 + 1;
  if (uVar4 <= local_4f0) {
    return;
  }
  uVar3 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_4f0 * 2);
  local_504 = local_4f0;
  if (uVar2 <= uVar3) goto code_r0x0010c937;
  goto LAB_0010ca33;
code_r0x0010c937:
  lVar1 = *(long *)(in_RDI + 0x38);
  uVar5 = in_RDI[0x3a];
  for (local_514 = in_RDI[0x3d]; local_514 < local_4f0; local_514 = local_514 + 1) {
    if (*(char *)(lVar1 + (ulong)(uVar5 * (ushort)(uVar3 - uVar2)) +
                 (ulong)(local_514 - in_RDI[0x3d])) != '\0') {
      gf256_muladd_mem(in_stack_fffffffffffffec8,in_stack_fffffffffffffec7,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb4);
    }
  }
  if ((ushort)(uVar3 - uVar2) < (ushort)in_RDI[5]) {
    if (in_RDI[0x3d] < local_4f0) {
      local_504 = in_RDI[0x3d];
    }
LAB_0010ca33:
    lVar1 = *(long *)(in_RDI + 0x26);
    uVar5 = in_RDI[0x2a];
    local_530 = 1L << ((byte)local_10 & 0x3f);
    for (local_534 = local_10; local_534 < local_504; local_534 = local_534 + 1) {
      if ((*(ulong *)(lVar1 + (ulong)(uVar5 * uVar3) * 8 + (ulong)(local_534 >> 6) * 8) & local_530)
          != 0) {
        gf256_add_mem(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc)
        ;
      }
      local_530 = local_530 << 1 | local_530 >> 0x3f;
    }
  }
  goto LAB_0010c8c3;
}

Assistant:

void Codec::AddSubdiagonalValues()
{
    CAT_IF_DUMP(cout << endl << "---- AddSubdiagonalValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0; unsigned heavyops = 0;)

    const unsigned column_count = _defer_count + _mix_count;
    unsigned pivot_i = 0;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

#if defined(CAT_WINDOWED_LOWERTRI)
    const uint16_t first_non_binary_row = first_heavy_row + _extra_count;

    // Build temporary storage space if windowing is to be used
    if (column_count >= CAT_UNDER_WIN_THRESH_5)
    {
        unsigned w, next_check_i;

        // Calculate initial window size
        if (column_count >= CAT_UNDER_WIN_THRESH_7)
        {
            w = 7;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_7;
        }
        else if (column_count >= CAT_UNDER_WIN_THRESH_6)
        {
            w = 6;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_6;
        }
        else if (column_count >= CAT_UNDER_WIN_THRESH_5)
        {
            w = 5;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_5;
        }
        else
        {
            w = 4;
            next_check_i = CAT_UNDER_WIN_THRESH_4;
        }
        uint32_t win_lim = 1 << w;

        CAT_IF_DUMP(cout << "Activating windowed lower triangular elimination with initial window " << w << endl;)

        // Use the first few peel column values as window table space
        // Note that the peeled column values were previously used up until this point,
        // but now they are unused, and so they can be reused for temporary space
        uint8_t * GF256_RESTRICT win_table[128];
        const PeelColumn * GF256_RESTRICT column = _peel_cols;
        uint8_t * GF256_RESTRICT column_src = _recovery_blocks;
        uint32_t jj = 1;

        for (uint32_t count = _block_count; count > 0; --count, ++column, column_src += _block_bytes)
        {
            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                // Reuse the block value temporarily as window table space
                win_table[jj] = column_src;

                CAT_IF_DUMP(cout << "-- Window table entry " << jj << " set to column " << _block_count - count << endl;)

                // If done:
                if (++jj >= win_lim) {
                    break;
                }
            }
        }

        CAT_IF_DUMP(if (jj < win_lim) {
            cout << "!! Not enough space in peeled columns to generate a table.  " \
                "Going back to normal lower triangular elimination." << endl;
        })

        // If enough space was found:
        if (jj >= win_lim) for (;;)
        {
            // Calculate first column in window
            const unsigned final_i = pivot_i + w - 1;

            CAT_IF_DUMP(cout << "-- Windowing from " << pivot_i << " to " << final_i << " (inclusive)" << endl;)

            // Eliminate lower triangular part below windowed bits:

            uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

            // For each column:
            for (unsigned src_pivot_i = pivot_i; src_pivot_i < final_i; ++src_pivot_i)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[src_pivot_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[src_pivot_i];

                CAT_IF_DUMP(cout << "Back-substituting small triangle from pivot " << src_pivot_i << "[" << (unsigned)src[0] << "] :";)

                const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (src_pivot_i >> 6);

                // For each row above the diagonal:
                for (unsigned dest_pivot_i = src_pivot_i + 1; dest_pivot_i <= final_i; ++dest_pivot_i)
                {
                    // If row is heavy:
                    const uint16_t dest_row_i = _pivots[dest_pivot_i];

                    // If bit is set in that row:
                    if (ge_row[_ge_pitch * dest_row_i] & ge_mask)
                    {
                        const uint16_t dest_col_i = _ge_col_map[dest_pivot_i];
                        CAT_DEBUG_ASSERT(dest_col_i < _block_count + _mix_count);

                        CAT_DEBUG_ASSERT(dest_col_i < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_col_i;

                        // Back-substitute
                        gf256_add_mem(dest, src, _block_bytes);

                        CAT_IF_ROWOP(++rowops;)

                        CAT_IF_DUMP(cout << " " << dest_pivot_i;)
                    }
                } // next pivot above

                CAT_IF_DUMP(cout << endl;)

                ge_mask = CAT_ROL64(ge_mask, 1);
            } // next pivot

            CAT_IF_DUMP(cout << "-- Generating window table with " << w << " bits" << endl;)

            // Generate window table: 2 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i] < _recovery_rows);
            win_table[1] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i];
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 1] < _recovery_rows);
            win_table[2] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 1];
            gf256_addset_mem(win_table[3], win_table[1], win_table[2], _block_bytes);
            CAT_IF_ROWOP(++rowops;)

            // Generate window table: 3 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 2] < _recovery_rows);
            win_table[4] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 2];
            gf256_addset_mem(win_table[5], win_table[1], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[6], win_table[2], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[7], win_table[1], win_table[6], _block_bytes);
            CAT_IF_ROWOP(rowops += 3;)

            // Generate window table: 4 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 3] < _recovery_rows);
            win_table[8] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 3];
            for (unsigned ii = 1; ii < 8; ++ii) {
                gf256_addset_mem(win_table[8 + ii], win_table[ii], win_table[8], _block_bytes);
            }
            CAT_IF_ROWOP(rowops += 7;)

            // Generate window table: 5+ bits
            if (w >= 5)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 4] < _recovery_rows);
                win_table[16] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 4];
                for (unsigned ii = 1; ii < 16; ++ii) {
                    gf256_addset_mem(win_table[16 + ii], win_table[ii], win_table[16], _block_bytes);
                }
                CAT_IF_ROWOP(rowops += 15;)

                if (w >= 6)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 5] < _recovery_rows);
                    win_table[32] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 5];
                    for (unsigned ii = 1; ii < 32; ++ii) {
                        gf256_addset_mem(win_table[32 + ii], win_table[ii], win_table[32], _block_bytes);
                    }
                    CAT_IF_ROWOP(rowops += 31;)

                    if (w >= 7)
                    {
                        CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 6] < _recovery_rows);
                        win_table[64] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 6];
                        for (unsigned ii = 1; ii < 64; ++ii) {
                            gf256_addset_mem(win_table[64 + ii], win_table[ii], win_table[64], _block_bytes);
                        }
                        CAT_IF_ROWOP(rowops += 63;)
                    }
                }
            }

            const unsigned first_word = pivot_i >> 6;
            const unsigned shift0 = pivot_i & 63;
            const unsigned last_word = final_i >> 6;
            const uint16_t * GF256_RESTRICT pivot_row = _pivots + final_i + 1;

            // If not straddling words:
            if (first_word == last_word)
            {
                // For each pivot row:
                for (unsigned ge_below_i = final_i + 1; ge_below_i < column_count; ++ge_below_i)
                {
                    const uint16_t ge_row_i = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_i >= first_non_binary_row) {
                        continue;
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_i;
                    const unsigned win_bits = (uint32_t)(ge_row[0] >> shift0) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << ge_below_i << endl;)

                        // Back-substitute
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_below_i];
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);
                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }
            else // Rare: Straddling case
            {
                const unsigned shift1 = 64 - shift0;

                // For each pivot row:
                for (unsigned ge_below_i = final_i + 1; ge_below_i < column_count; ++ge_below_i)
                {
                    // If pivot row is heavy:
                    const uint16_t ge_row_i = *pivot_row++;
                    if (ge_row_i >= first_non_binary_row) {
                        continue;
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_i;
                    const uint32_t win_bits = ( (uint32_t)(ge_row[0] >> shift0) | (uint32_t)(ge_row[1] << shift1) ) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << ge_below_i << endl;)

                        // Back-substitute
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_below_i];
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);
                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }

            // If column index falls below window size:
            pivot_i += w;
            if (pivot_i >= next_check_i)
            {
                CAT_DEBUG_ASSERT(pivot_i < column_count);
                const unsigned remaining_columns = column_count - pivot_i;

                if (remaining_columns >= CAT_UNDER_WIN_THRESH_6) {
                    w = 6;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_6;
                }
                else if (remaining_columns >= CAT_UNDER_WIN_THRESH_5) {
                    w = 5;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_5;
                }
                else if (remaining_columns >= CAT_UNDER_WIN_THRESH_4) {
                    w = 4;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_4;
                }
                else {
                    break;
                }

                // Update window limit
                win_lim = 1 << w;
            }
        } // next window
    } // end if windowed
#endif // CAT_WINDOWED_LOWERTRI

    // For each row to eliminate:
    for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
    {
        // Lookup pivot column, GE row, and destination buffer
        const unsigned column_i = _ge_col_map[ge_column_i];
        const uint16_t ge_row_i = _pivots[ge_column_i];
        CAT_DEBUG_ASSERT(column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * column_i;

        CAT_IF_DUMP(cout << "Pivot " << ge_column_i << " solving column " << column_i << "[" << (unsigned)dest[0] << "] with GE row " << ge_row_i << " :";)

        unsigned ge_limit = ge_column_i;

        // If row is heavy or extra:
        if (ge_row_i >= first_heavy_row)
        {
            const uint16_t heavy_row_i = ge_row_i - first_heavy_row;

            // For each column up to the diagonal:
            const uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;
            for (unsigned sub_i = _first_heavy_column; sub_i < ge_limit; ++sub_i)
            {
                // If column is zero:
                const uint8_t code_value = heavy_row[sub_i - _first_heavy_column];
                if (0 == code_value) {
                    continue; // Skip it
                }

                // Look up data source
                CAT_DEBUG_ASSERT(_ge_col_map[sub_i] < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[sub_i];

                gf256_muladd_mem(dest, code_value, src, _block_bytes);

                CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                CAT_IF_DUMP(cout << " h" << ge_column_i << "=[" << (unsigned)src[0] << "*" << (unsigned)code_value << "]";)
            }

            // If row is not extra:
            if (heavy_row_i >= _extra_count) {
                CAT_IF_DUMP(cout << endl;)
                continue; // Skip binary matrix elimination
            }

            // Limit the binary matrix elimination to non-heavy columns
            if (ge_limit > _first_heavy_column) {
                ge_limit = _first_heavy_column;
            }

            // fall-thru..
        }

        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * ge_row_i;
        uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

        // For each GE matrix bit in the row:
        for (unsigned bit_j = pivot_i; bit_j < ge_limit; ++bit_j)
        {
            // If bit is non-zero:
            if (0 != (ge_row[bit_j >> 6] & ge_mask))
            {
                const unsigned column_j = _ge_col_map[bit_j];
                CAT_DEBUG_ASSERT(column_j < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * column_j;

                // Add pivot for non-zero bit to destination row value
                gf256_add_mem(dest, src, _block_bytes);
                CAT_IF_ROWOP(++rowops;)

                CAT_IF_DUMP(cout << " " << bit_j << "=[" << (unsigned)src[0] << "]";)
            }

            ge_mask = CAT_ROL64(ge_mask, 1);
        }

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "AddSubdiagonalValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N and " << heavyops << " heavy ops" << endl;)
}